

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  long lVar1;
  sqlite3 *in_RSI;
  WhereMemBlock *pNext;
  WhereLoop *p;
  WhereLoop *in_stack_ffffffffffffffd8;
  sqlite3 *in_stack_ffffffffffffffe0;
  undefined8 uVar2;
  void *in_stack_ffffffffffffffe8;
  
  sqlite3WhereClauseClear((WhereClause *)in_RSI);
  while (*(Bitmask *)&in_RSI->errCode != 0) {
    in_stack_ffffffffffffffe8 = *(void **)&in_RSI->errCode;
    *(Bitmask *)&in_RSI->errCode = *(Bitmask *)((long)in_stack_ffffffffffffffe8 + 0x48);
    whereLoopDelete(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  }
  while (lVar1._0_4_ = in_RSI->errMask, lVar1._4_4_ = in_RSI->iSysErrno, lVar1 != 0) {
    uVar2 = **(undefined8 **)&in_RSI->errMask;
    sqlite3DbNNFreeNN(in_RSI,in_stack_ffffffffffffffe8);
    in_RSI->errMask = (int)uVar2;
    in_RSI->iSysErrno = (int)((ulong)uVar2 >> 0x20);
  }
  sqlite3DbNNFreeNN(in_RSI,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  assert( pWInfo!=0 );
  assert( db!=0 );
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while( pWInfo->pLoops ){
    WhereLoop *p = pWInfo->pLoops;
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db, p);
  }
  while( pWInfo->pMemToFree ){
    WhereMemBlock *pNext = pWInfo->pMemToFree->pNext;
    sqlite3DbNNFreeNN(db, pWInfo->pMemToFree);
    pWInfo->pMemToFree = pNext;
  }
  sqlite3DbNNFreeNN(db, pWInfo);
}